

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O2

void __thiscall
NaPolynomialFunc::NaPolynomialFunc(NaPolynomialFunc *this,char *szOptions,NaVector *vInit)

{
  NaDynAr<double> *this_00;
  int iVar1;
  char *__s;
  char *__nptr;
  undefined4 extraout_var;
  uint uVar2;
  NaReal fTest;
  char *szRest;
  double local_40;
  char *local_38;
  
  NaExternFunc::NaExternFunc(&this->super_NaExternFunc);
  *(undefined ***)this = &PTR_PrintLog_00104c50;
  (this->vfK)._vptr_NaDynAr = (_func_int **)&PTR__NaDynAr_00104cd8;
  (this->vfK).nItems = 0;
  this_00 = &this->vfK;
  (this->vfK).pHead = (item *)0x0;
  (this->vfK).pTail = (item *)0x0;
  __s = strdup(szOptions);
  __nptr = strtok(__s," ");
  while (__nptr != (char *)0x0) {
    local_40 = strtod(__nptr,&local_38);
    if (local_38 != __nptr) {
      NaDynAr<double>::addl(this_00,&local_40);
    }
    __nptr = strtok((char *)0x0," ");
  }
  free(__s);
  NaPrintLog("polynomial coefficients:");
  uVar2 = (this->vfK).nItems;
  while (0 < (int)uVar2) {
    uVar2 = uVar2 - 1;
    iVar1 = (*this_00->_vptr_NaDynAr[0xf])(this_00,(ulong)uVar2);
    NaPrintLog(" k[%d]=%g",(int)*(undefined8 *)CONCAT44(extraout_var,iVar1),(ulong)uVar2);
  }
  NaPrintLog("\n");
  return;
}

Assistant:

NaPolynomialFunc::NaPolynomialFunc (char* szOptions, NaVector& vInit)
{
    char	*szThis = strdup(szOptions), *szRest, *szToken;
    NaReal	fTest;

    for(szToken = strtok(szThis, " ");
	NULL != szToken;
	szToken = strtok(NULL, " ")) {
	// Check for proper floating point number
	fTest = strtod(szToken, &szRest);
	if(szRest == szToken)
	    continue;
	vfK.addl(fTest);
    }
    free(szThis);

    NaPrintLog("polynomial coefficients:");
    for(int i = vfK.count()-1; i >= 0; --i) {
	NaPrintLog(" k[%d]=%g", i, vfK[i]);
    }
    NaPrintLog("\n");
}